

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O0

Interfaces __thiscall QDBusXmlToCpp::readInput(QDBusXmlToCpp *this)

{
  QLatin1StringView latin1;
  bool bVar1;
  QString *pQVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  char *in_RSI;
  QMapData<std::map<QString,_QSharedDataPointer<QDBusIntrospection::Interface>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSharedDataPointer<QDBusIntrospection::Interface>_>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  Interfaces *interfaces;
  QByteArray data;
  QFile input;
  QString *in_stack_fffffffffffffe98;
  FileHandleFlag flags;
  FILE *pFVar6;
  DiagnosticsReporter *in_stack_fffffffffffffea0;
  QString *in_stack_fffffffffffffea8;
  QString *in_stack_fffffffffffffeb8;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSharedDataPointer<QDBusIntrospection::Interface>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSharedDataPointer<QDBusIntrospection::Interface>_>_>_>_>_>
  QVar7;
  bool local_11a;
  DiagnosticsReporter local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  QString local_c8 [3];
  QString local_78 [2];
  uint local_44;
  QLatin1StringView local_28;
  int local_18;
  undefined4 uStack_14;
  char *local_10;
  char *local_8;
  
  local_8 = *(char **)(in_FS_OFFSET + 0x28);
  local_18 = -0x55555556;
  uStack_14 = 0xaaaaaaaa;
  local_10 = (char *)0xaaaaaaaaaaaaaaaa;
  QVar7.d.ptr = (totally_ordered_wrapper<QMapData<std::map<QString,_QSharedDataPointer<QDBusIntrospection::Interface>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSharedDataPointer<QDBusIntrospection::Interface>_>_>_>_>_*>
                 )(totally_ordered_wrapper<QMapData<std::map<QString,_QSharedDataPointer<QDBusIntrospection::Interface>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSharedDataPointer<QDBusIntrospection::Interface>_>_>_>_>_*>
                   )in_RDI;
  QFile::QFile((QFile *)&stack0xffffffffffffffe8,(QString *)(in_RSI + 0x48));
  bVar1 = QString::isEmpty((QString *)0x10538a);
  local_11a = true;
  if (!bVar1) {
    local_28 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0);
    local_11a = operator==(in_stack_fffffffffffffea8,(QLatin1StringView *)in_stack_fffffffffffffea0)
    ;
  }
  if (local_11a == false) {
    DiagnosticsReporter::setFileName(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffea0,
               (OpenModeFlag)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    uVar3 = QFile::open((QFlags *)&stack0xffffffffffffffe8);
    if ((uVar3 & 1) == 0) {
      pFVar6 = _stderr;
      QtPrivate::asString((QString *)(in_RSI + 0x48));
      QString::toLocal8Bit(in_stack_fffffffffffffeb8);
      pcVar4 = QByteArray::constData((QByteArray *)0x1055ae);
      QIODevice::errorString();
      QtPrivate::asString(local_c8);
      QString::toLocal8Bit(in_stack_fffffffffffffeb8);
      pcVar5 = QByteArray::constData((QByteArray *)0x1055f2);
      fprintf(pFVar6,"qdbusxml2cpp: could not open input file \'%s\': %s\n",pcVar4,pcVar5);
      QByteArray::~QByteArray((QByteArray *)0x105619);
      QString::~QString((QString *)0x105626);
      QByteArray::~QByteArray((QByteArray *)0x105633);
      exit(1);
    }
  }
  else {
    pQVar2 = (QString *)(in_RSI + 200);
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0);
    latin1.m_data = in_RSI;
    latin1.m_size = (qsizetype)QVar7.d.ptr;
    QString::QString(pQVar2,latin1);
    DiagnosticsReporter::setFileName(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    flags = (FileHandleFlag)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    QString::~QString((QString *)0x10544a);
    pQVar2 = _stdin;
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffea0,flags);
    QFlags<QFileDevice::FileHandleFlag>::QFlags
              ((QFlags<QFileDevice::FileHandleFlag> *)in_stack_fffffffffffffea0,flags);
    uVar3 = QFile::open((_IO_FILE *)&stack0xffffffffffffffe8,(QFlags *)pQVar2,
                        (QFlags *)(ulong)local_44);
    if ((uVar3 & 1) == 0) {
      pFVar6 = _stderr;
      QIODevice::errorString();
      QtPrivate::asString(local_78);
      QString::toLocal8Bit(pQVar2);
      pcVar4 = QByteArray::constData((QByteArray *)0x1054f0);
      fprintf(pFVar6,"qdbusxml2cpp: could not open standard input: %s\n",pcVar4);
      QByteArray::~QByteArray((QByteArray *)0x105513);
      QString::~QString((QString *)0x105520);
      exit(1);
    }
  }
  local_e0 = 0xaaaaaaaaaaaaaaaa;
  local_d8 = 0xaaaaaaaaaaaaaaaa;
  local_d0 = 0xaaaaaaaaaaaaaaaa;
  QIODevice::readAll();
  *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
  QString::fromUtf8<void>((QByteArray *)in_stack_fffffffffffffea0);
  QDBusIntrospection::parseInterfaces((QString *)in_RDI,local_f8);
  QString::~QString((QString *)0x1056cc);
  bVar1 = DiagnosticsReporter::hadErrors((DiagnosticsReporter *)(in_RSI + 200));
  if (!bVar1) {
    QByteArray::~QByteArray((QByteArray *)0x105710);
    QFile::~QFile((QFile *)&stack0xffffffffffffffe8);
    if (*(char **)(in_FS_OFFSET + 0x28) == local_8) {
      return (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSharedDataPointer<QDBusIntrospection::Interface>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSharedDataPointer<QDBusIntrospection::Interface>_>_>_>_>_>
              )(QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSharedDataPointer<QDBusIntrospection::Interface>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSharedDataPointer<QDBusIntrospection::Interface>_>_>_>_>_>
                )QVar7.d.ptr;
    }
    __stack_chk_fail();
  }
  exit(1);
}

Assistant:

QDBusIntrospection::Interfaces QDBusXmlToCpp::readInput()
{
    QFile input(inputFile);
    if (inputFile.isEmpty() || inputFile == "-"_L1) {
        reporter.setFileName("<standard input>"_L1);
        if (!input.open(stdin, QIODevice::ReadOnly)) {
            fprintf(stderr, PROGRAMNAME ": could not open standard input: %s\n",
                    qPrintable(input.errorString()));
            exit(1);
        }
    } else {
        reporter.setFileName(inputFile);
        if (!input.open(QIODevice::ReadOnly)) {
            fprintf(stderr, PROGRAMNAME ": could not open input file '%s': %s\n",
                    qPrintable(inputFile), qPrintable(input.errorString()));
            exit(1);
        }
    }

    QByteArray data = input.readAll();
    auto interfaces = QDBusIntrospection::parseInterfaces(QString::fromUtf8(data), &reporter);
    if (reporter.hadErrors())
        exit(1);

    return interfaces;
}